

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.hpp
# Opt level: O2

pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
* __thiscall
jessilib::
split_once<std::basic_string_view<char8_t,std::char_traits<char8_t>>,char8_t_const*,char8_t_const*,char8_t>
          (pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>
           *__return_storage_ptr__,jessilib *this,char8_t *begin,char8_t *end,char8_t in_delim)

{
  size_t sVar1;
  
  if (begin <= this) {
    (__return_storage_ptr__->second)._M_len = 0;
    (__return_storage_ptr__->second)._M_str = (char8_t *)0x0;
    (__return_storage_ptr__->first)._M_len = 0;
    (__return_storage_ptr__->first)._M_str = (char8_t *)0x0;
    return __return_storage_ptr__;
  }
  sVar1 = 0;
  while( true ) {
    if (this + sVar1 == (jessilib *)begin) {
      (__return_storage_ptr__->first)._M_len = (long)begin - (long)this;
      (__return_storage_ptr__->first)._M_str = (char8_t *)this;
      (__return_storage_ptr__->second)._M_len = 0;
      (__return_storage_ptr__->second)._M_str = (char8_t *)0x0;
      return __return_storage_ptr__;
    }
    if (this[sVar1] == SUB81(end,0)) break;
    sVar1 = sVar1 + 1;
  }
  (__return_storage_ptr__->first)._M_len = sVar1;
  (__return_storage_ptr__->first)._M_str = (char8_t *)this;
  (__return_storage_ptr__->second)._M_len = (size_t)(begin + (~(ulong)this - sVar1));
  (__return_storage_ptr__->second)._M_str = (char8_t *)(this + sVar1 + 1);
  return __return_storage_ptr__;
}

Assistant:

constexpr auto split_once(ItrT begin, EndT end, ElementT in_delim) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to split
		return result;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_delim) {
			// in_delim found; split upon it
			result.first = make_split_member<MemberT>(begin, itr);
			result.second = make_split_member<MemberT>(itr + 1, end);
			return result;
		}
	}

	// in_delim not found
	result.first = make_split_member<MemberT>(begin, end);
	return result;
}